

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O3

void __thiscall zmq::dish_t::send_subscriptions(dish_t *this,pipe_t *pipe_)

{
  int iVar1;
  _Base_ptr p_Var2;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  _Rb_tree_header *p_Var3;
  msg_t msg;
  msg_t local_60;
  
  p_Var2 = (this->_subscriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->_subscriptions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      iVar1 = msg_t::init_join(&local_60);
      if (iVar1 != 0) {
        send_subscriptions();
      }
      iVar1 = msg_t::set_group(&local_60,*(char **)(p_Var2 + 1));
      __buf = extraout_RDX;
      if (iVar1 != 0) {
        send_subscriptions();
        __buf = extraout_RDX_00;
      }
      pipe_t::write(pipe_,(int)&local_60,__buf,in_RCX);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  pipe_t::flush(pipe_);
  return;
}

Assistant:

void zmq::dish_t::send_subscriptions (pipe_t *pipe_)
{
    for (subscriptions_t::iterator it = _subscriptions.begin (),
                                   end = _subscriptions.end ();
         it != end; ++it) {
        msg_t msg;
        int rc = msg.init_join ();
        errno_assert (rc == 0);

        rc = msg.set_group (it->c_str ());
        errno_assert (rc == 0);

        //  Send it to the pipe.
        pipe_->write (&msg);
    }

    pipe_->flush ();
}